

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  size_t sVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  char *pcVar8;
  undefined1 auVar9 [32];
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar35 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar37 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar38 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar36 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined4 uVar57;
  vfloat4 a0_1;
  undefined1 auVar58 [16];
  float fVar59;
  vfloat4 a0;
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  vfloat4 b1;
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  float fVar77;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar78 [32];
  undefined1 auVar85 [16];
  undefined1 in_ZMM17 [64];
  
  pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar3 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar5 = (pBVar4->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar4->super_RawBufferView).stride;
  lVar12 = sVar6 * uVar3;
  lVar13 = sVar6 * (uVar3 + 1);
  lVar10 = sVar6 * (uVar3 + 2);
  lVar11 = sVar6 * (uVar3 + 3);
  fVar59 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar7 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           normals.items;
  pcVar8 = (pBVar7->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar7->super_RawBufferView).stride;
  auVar35 = *(undefined1 (*) [16])(pcVar8 + uVar3 * sVar6);
  auVar36 = *(undefined1 (*) [16])(pcVar8 + (uVar3 + 1) * sVar6);
  auVar34 = *(undefined1 (*) [16])(pcVar8 + (uVar3 + 2) * sVar6);
  auVar45._16_16_ = in_YmmResult._16_16_;
  auVar33 = *(undefined1 (*) [16])(pcVar8 + sVar6 * (uVar3 + 3));
  aVar1 = (space->vx).field_0;
  aVar2 = (space->vy).field_0;
  auVar37 = *(undefined1 (*) [16])(space->vz).field_0.m128;
  auVar31 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar5 + lVar12),
                              ZEXT416((uint)(fVar59 * *(float *)(pcVar5 + lVar12 + 0xc))),0x30);
  auVar32 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar5 + lVar13),
                              ZEXT416((uint)(fVar59 * *(float *)(pcVar5 + lVar13 + 0xc))),0x30);
  auVar58 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar5 + lVar10),
                              ZEXT416((uint)(fVar59 * *(float *)(pcVar5 + lVar10 + 0xc))),0x30);
  auVar30 = vinsertps_avx(*(undefined1 (*) [16])(pcVar5 + lVar11),
                          ZEXT416((uint)(fVar59 * *(float *)(pcVar5 + lVar11 + 0xc))),0x30);
  auVar75._8_4_ = 0x80000000;
  auVar75._0_8_ = 0x8000000080000000;
  auVar75._12_4_ = 0x80000000;
  auVar14 = vmulps_avx512vl(auVar30,auVar75);
  auVar45._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar15 = vfmadd213ps_avx512vl(ZEXT816(0),auVar58,auVar14);
  auVar15 = vaddps_avx512vl(auVar32,auVar15);
  auVar16 = vfmadd231ps_avx512vl(auVar15,auVar31,auVar75);
  auVar29 = vshufps_avx(auVar16,auVar16,0xff);
  auVar17 = vmulps_avx512vl(auVar33,auVar75);
  auVar15 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar34,auVar17);
  auVar18._0_4_ = auVar36._0_4_ + auVar15._0_4_;
  auVar18._4_4_ = auVar36._4_4_ + auVar15._4_4_;
  auVar18._8_4_ = auVar36._8_4_ + auVar15._8_4_;
  auVar18._12_4_ = auVar36._12_4_ + auVar15._12_4_;
  auVar28 = vfmadd231ps_fma(auVar18,auVar35,auVar75);
  auVar15 = vmulps_avx512vl(auVar30,auVar45._0_16_);
  auVar60._8_4_ = 0x3f000000;
  auVar60._0_8_ = 0x3f0000003f000000;
  auVar60._12_4_ = 0x3f000000;
  auVar15 = vfmadd231ps_avx512vl(auVar15,auVar58,auVar60);
  auVar15 = vfmadd231ps_avx512vl(auVar15,auVar32,auVar45._0_16_);
  auVar18 = vfnmadd231ps_avx512vl(auVar15,auVar31,auVar60);
  auVar27 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar15 = vshufps_avx(auVar28,auVar28,0xc9);
  auVar22._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar22._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar22._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar22._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar15 = vfmsub231ps_fma(auVar22,auVar27,auVar28);
  auVar28 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar15 = vdpps_avx(auVar28,auVar28,0x7f);
  fVar61 = auVar15._0_4_;
  auVar43._4_28_ = auVar45._4_28_;
  auVar43._0_4_ = fVar61;
  auVar19 = vrsqrt14ss_avx512f(auVar45._0_16_,auVar43._0_16_);
  auVar20 = vmulss_avx512f(auVar19,ZEXT416(0x3fc00000));
  auVar21 = vmulss_avx512f(auVar15,ZEXT416(0xbf000000));
  auVar21 = vmulss_avx512f(auVar21,auVar19);
  auVar19 = vmulss_avx512f(auVar19,auVar19);
  auVar19 = vmulss_avx512f(auVar21,auVar19);
  auVar19 = vaddss_avx512f(auVar20,auVar19);
  auVar19 = vbroadcastss_avx512vl(auVar19);
  auVar20 = vmulps_avx512vl(auVar28,auVar19);
  auVar21 = vmulps_avx512vl(auVar29,auVar20);
  auVar22 = vaddps_avx512vl(auVar16,auVar21);
  auVar23 = vbroadcastss_avx512vl(auVar22);
  auVar24 = vshufps_avx512vl(auVar22,auVar22,0x55);
  auVar25 = vshufps_avx512vl(auVar22,auVar22,0xaa);
  auVar25 = vmulps_avx512vl(auVar37,auVar25);
  auVar24 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar2,auVar24);
  auVar23 = vfmadd231ps_avx512vl(auVar24,(undefined1  [16])aVar1,auVar23);
  auVar24 = vshufps_avx512vl(auVar18,auVar18,0xff);
  auVar20 = vmulps_avx512vl(auVar24,auVar20);
  auVar24 = vrcp14ss_avx512f(auVar45._0_16_,auVar43._0_16_);
  auVar25 = vmulps_avx512vl(auVar33,auVar45._0_16_);
  auVar25 = vfmadd231ps_avx512vl(auVar25,auVar34,auVar60);
  auVar25 = vfmadd231ps_avx512vl(auVar25,auVar36,auVar45._0_16_);
  auVar25 = vfnmadd231ps_avx512vl(auVar25,auVar35,auVar60);
  auVar26 = vshufps_avx512vl(auVar25,auVar25,0xc9);
  auVar26 = vmulps_avx512vl(auVar18,auVar26);
  auVar27 = vfmsub231ps_avx512vl(auVar26,auVar27,auVar25);
  auVar15 = vfnmadd213ss_avx512f(auVar15,auVar24,ZEXT416(0x40000000));
  fVar59 = auVar24._0_4_ * auVar15._0_4_;
  auVar15 = vshufps_avx512vl(auVar27,auVar27,0xc9);
  auVar25._0_4_ = fVar61 * auVar15._0_4_;
  auVar25._4_4_ = fVar61 * auVar15._4_4_;
  auVar25._8_4_ = fVar61 * auVar15._8_4_;
  auVar25._12_4_ = fVar61 * auVar15._12_4_;
  auVar15 = vdpps_avx(auVar28,auVar15,0x7f);
  fVar61 = auVar15._0_4_;
  auVar24._0_4_ = fVar61 * auVar28._0_4_;
  auVar24._4_4_ = fVar61 * auVar28._4_4_;
  auVar24._8_4_ = fVar61 * auVar28._8_4_;
  auVar24._12_4_ = fVar61 * auVar28._12_4_;
  auVar15 = vsubps_avx(auVar25,auVar24);
  auVar27._0_4_ = fVar59 * auVar15._0_4_;
  auVar27._4_4_ = fVar59 * auVar15._4_4_;
  auVar27._8_4_ = fVar59 * auVar15._8_4_;
  auVar27._12_4_ = fVar59 * auVar15._12_4_;
  auVar15 = vmulps_avx512vl(auVar19,auVar27);
  auVar28._0_4_ = auVar29._0_4_ * auVar15._0_4_;
  auVar28._4_4_ = auVar29._4_4_ * auVar15._4_4_;
  auVar28._8_4_ = auVar29._8_4_ * auVar15._8_4_;
  auVar28._12_4_ = auVar29._12_4_ * auVar15._12_4_;
  auVar27 = vaddps_avx512vl(auVar20,auVar28);
  auVar29._0_4_ = auVar18._0_4_ + auVar27._0_4_;
  auVar29._4_4_ = auVar18._4_4_ + auVar27._4_4_;
  auVar29._8_4_ = auVar18._8_4_ + auVar27._8_4_;
  auVar29._12_4_ = auVar18._12_4_ + auVar27._12_4_;
  auVar15._8_4_ = 0x3eaaaaab;
  auVar15._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar15._12_4_ = 0x3eaaaaab;
  auVar15 = vmulps_avx512vl(auVar29,auVar15);
  auVar28 = vaddps_avx512vl(auVar22,auVar15);
  auVar15 = vshufps_avx(auVar28,auVar28,0x55);
  auVar29 = vshufps_avx(auVar28,auVar28,0xaa);
  auVar29 = vmulps_avx512vl(auVar37,auVar29);
  auVar15 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])aVar2,auVar15);
  auVar19._0_4_ = auVar28._0_4_;
  auVar19._4_4_ = auVar19._0_4_;
  auVar19._8_4_ = auVar19._0_4_;
  auVar19._12_4_ = auVar19._0_4_;
  auVar29 = vfmadd231ps_avx512vl(auVar15,(undefined1  [16])aVar1,auVar19);
  auVar15 = vaddps_avx512vl(auVar58,auVar14);
  auVar15 = vfmadd231ps_avx512vl(auVar15,auVar32,auVar45._0_16_);
  auVar28 = vfmadd231ps_avx512vl(auVar15,auVar31,auVar75);
  auVar15 = vaddps_avx512vl(auVar34,auVar17);
  auVar15 = vfmadd231ps_avx512vl(auVar15,auVar36,auVar45._0_16_);
  auVar15 = vfmadd231ps_fma(auVar15,auVar35,auVar75);
  auVar30 = vmulps_avx512vl(auVar30,auVar60);
  auVar30 = vfmadd231ps_avx512vl(auVar30,auVar45._0_16_,auVar58);
  auVar30 = vfnmadd231ps_avx512vl(auVar30,auVar60,auVar32);
  auVar30 = vfmadd231ps_avx512vl(auVar30,auVar45._0_16_,auVar31);
  auVar31 = vshufps_avx512vl(auVar30,auVar30,0xc9);
  auVar32 = vshufps_avx512vl(auVar15,auVar15,0xc9);
  auVar32 = vmulps_avx512vl(auVar30,auVar32);
  auVar15 = vfmsub231ps_avx512vl(auVar32,auVar31,auVar15);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar33 = vmulps_avx512vl(auVar33,auVar60);
  auVar34 = vfmadd231ps_avx512vl(auVar33,auVar45._0_16_,auVar34);
  auVar39 = vpermps_avx512vl(auVar38,ZEXT1632(auVar23));
  auVar33 = vshufps_avx512vl(auVar15,auVar15,0xc9);
  auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar36,auVar60);
  auVar36 = vdpps_avx(auVar33,auVar33,0x7f);
  auVar40 = vpermps_avx512vl(auVar38,ZEXT1632(auVar29));
  auVar46._16_16_ = auVar40._16_16_;
  auVar35 = vfmadd231ps_avx512vl(auVar34,auVar45._0_16_,auVar35);
  auVar34 = vshufps_avx512vl(auVar35,auVar35,0xc9);
  auVar34 = vmulps_avx512vl(auVar30,auVar34);
  auVar35 = vfmsub231ps_avx512vl(auVar34,auVar31,auVar35);
  auVar46._0_16_ = auVar45._0_16_;
  auVar47._4_28_ = auVar46._4_28_;
  auVar47._0_4_ = auVar36._0_4_;
  auVar34 = vrsqrt14ss_avx512f(auVar45._0_16_,auVar47._0_16_);
  auVar15 = vmulss_avx512f(auVar34,ZEXT416(0x3fc00000));
  auVar31 = vmulss_avx512f(auVar36,ZEXT416(0xbf000000));
  auVar31 = vmulss_avx512f(auVar31,auVar34);
  auVar34 = vmulss_avx512f(auVar31,ZEXT416((uint)(auVar34._0_4_ * auVar34._0_4_)));
  auVar31 = vshufps_avx512vl(auVar28,auVar28,0xff);
  auVar34 = vaddss_avx512f(auVar15,auVar34);
  fVar61 = auVar34._0_4_;
  auVar34 = vbroadcastss_avx512vl(auVar36);
  auVar35 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar34 = vmulps_avx512vl(auVar34,auVar35);
  auVar35 = vdpps_avx(auVar33,auVar35,0x7f);
  fVar59 = auVar35._0_4_;
  auVar17._0_4_ = fVar59 * auVar33._0_4_;
  auVar17._4_4_ = fVar59 * auVar33._4_4_;
  auVar17._8_4_ = fVar59 * auVar33._8_4_;
  auVar17._12_4_ = fVar59 * auVar33._12_4_;
  auVar32._0_4_ = fVar61 * auVar33._0_4_;
  auVar32._4_4_ = fVar61 * auVar33._4_4_;
  auVar32._8_4_ = fVar61 * auVar33._8_4_;
  auVar32._12_4_ = fVar61 * auVar33._12_4_;
  auVar35 = vsubps_avx512vl(auVar34,auVar17);
  auVar34 = vshufps_avx512vl(auVar30,auVar30,0xff);
  auVar34 = vmulps_avx512vl(auVar34,auVar32);
  auVar33 = vmulps_avx512vl(auVar31,auVar32);
  auVar15 = vrcp14ss_avx512f(auVar45._0_16_,auVar47._0_16_);
  auVar32 = vaddps_avx512vl(auVar28,auVar33);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar15,ZEXT416(0x40000000));
  fVar59 = auVar15._0_4_ * auVar36._0_4_;
  auVar36._4_4_ = fVar59;
  auVar36._0_4_ = fVar59;
  auVar36._8_4_ = fVar59;
  auVar36._12_4_ = fVar59;
  auVar35 = vmulps_avx512vl(auVar35,auVar36);
  auVar58._0_4_ = fVar61 * auVar35._0_4_;
  auVar58._4_4_ = fVar61 * auVar35._4_4_;
  auVar58._8_4_ = fVar61 * auVar35._8_4_;
  auVar58._12_4_ = fVar61 * auVar35._12_4_;
  auVar35 = vmulps_avx512vl(auVar31,auVar58);
  auVar34 = vaddps_avx512vl(auVar34,auVar35);
  auVar36 = vaddps_avx512vl(auVar30,auVar34);
  auVar35._8_4_ = 0x3eaaaaab;
  auVar35._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar35._12_4_ = 0x3eaaaaab;
  auVar35 = vmulps_avx512vl(auVar36,auVar35);
  auVar35 = vsubps_avx(auVar32,auVar35);
  uVar57 = auVar35._0_4_;
  auVar31._4_4_ = uVar57;
  auVar31._0_4_ = uVar57;
  auVar31._8_4_ = uVar57;
  auVar31._12_4_ = uVar57;
  auVar36 = vshufps_avx512vl(auVar35,auVar35,0x55);
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  fVar61 = auVar37._0_4_;
  auVar20._0_4_ = fVar61 * auVar35._0_4_;
  fVar62 = auVar37._4_4_;
  auVar20._4_4_ = fVar62 * auVar35._4_4_;
  fVar63 = auVar37._8_4_;
  auVar20._8_4_ = fVar63 * auVar35._8_4_;
  fVar64 = auVar37._12_4_;
  auVar20._12_4_ = fVar64 * auVar35._12_4_;
  auVar35 = vfmadd231ps_avx512vl(auVar20,(undefined1  [16])aVar2,auVar36);
  auVar36 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar1,auVar31);
  auVar41 = vpermps_avx512vl(auVar38,ZEXT1632(auVar36));
  auVar15 = vbroadcastss_avx512vl(auVar32);
  auVar31 = vshufps_avx512vl(auVar32,auVar32,0x55);
  auVar35 = vshufps_avx(auVar32,auVar32,0xaa);
  auVar14._0_4_ = fVar61 * auVar35._0_4_;
  auVar14._4_4_ = fVar62 * auVar35._4_4_;
  auVar14._8_4_ = fVar63 * auVar35._8_4_;
  auVar14._12_4_ = fVar64 * auVar35._12_4_;
  auVar35 = vfmadd231ps_avx512vl(auVar14,(undefined1  [16])aVar2,auVar31);
  auVar15 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar1,auVar15);
  auVar42 = vpermps_avx512vl(auVar38,ZEXT1632(auVar15));
  auVar38 = vmulps_avx512vl(auVar42,bezier_basis0._3944_32_);
  auVar38 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._2788_32_,auVar41);
  auVar38 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._1632_32_,auVar40);
  auVar65._8_4_ = 0xff800000;
  auVar65._0_8_ = 0xff800000ff800000;
  auVar65._12_4_ = 0xff800000;
  auVar65._16_4_ = 0xff800000;
  auVar65._20_4_ = 0xff800000;
  auVar65._24_4_ = 0xff800000;
  auVar65._28_4_ = 0xff800000;
  auVar43 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._476_32_,auVar39);
  auVar44 = vmaxps_avx512vl(auVar65,auVar43);
  fVar77 = bezier_basis0._8568_4_;
  fVar79 = bezier_basis0._8572_4_;
  auVar38._4_4_ = fVar79 * auVar42._4_4_;
  auVar38._0_4_ = fVar77 * auVar42._0_4_;
  fVar80 = bezier_basis0._8576_4_;
  auVar38._8_4_ = fVar80 * auVar42._8_4_;
  fVar81 = bezier_basis0._8580_4_;
  auVar38._12_4_ = fVar81 * auVar42._12_4_;
  fVar82 = bezier_basis0._8584_4_;
  auVar38._16_4_ = fVar82 * auVar42._16_4_;
  fVar83 = bezier_basis0._8588_4_;
  auVar38._20_4_ = fVar83 * auVar42._20_4_;
  fVar84 = bezier_basis0._8592_4_;
  auVar38._24_4_ = fVar84 * auVar42._24_4_;
  auVar38._28_4_ = auVar42._28_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._7412_32_,auVar41);
  auVar38 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._6256_32_,auVar40);
  auVar38 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._5100_32_,auVar39);
  auVar50._8_4_ = 0x3d638e39;
  auVar50._0_8_ = 0x3d638e393d638e39;
  auVar50._12_4_ = 0x3d638e39;
  auVar50._16_4_ = 0x3d638e39;
  auVar50._20_4_ = 0x3d638e39;
  auVar50._24_4_ = 0x3d638e39;
  auVar50._28_4_ = 0x3d638e39;
  auVar48._0_4_ = auVar38._0_4_ * 0.055555556;
  auVar48._4_4_ = auVar38._4_4_ * 0.055555556;
  auVar48._8_4_ = auVar38._8_4_ * 0.055555556;
  auVar48._12_4_ = auVar38._12_4_ * 0.055555556;
  auVar48._16_4_ = auVar38._16_4_ * 0.055555556;
  auVar48._20_4_ = auVar38._20_4_ * 0.055555556;
  auVar48._24_4_ = auVar38._24_4_ * 0.055555556;
  auVar48._28_4_ = 0;
  auVar38 = vblendps_avx(auVar48,ZEXT832(0) << 0x20,1);
  auVar45 = vsubps_avx512vl(auVar43,auVar38);
  auVar38 = vblendps_avx(auVar48,ZEXT832(0) << 0x20,0x80);
  auVar46 = vaddps_avx512vl(auVar43,auVar38);
  auVar38 = vmaxps_avx512vl(auVar45,auVar46);
  auVar47 = vmaxps_avx512vl(auVar44,auVar38);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar38 = vpermps_avx512vl(auVar48,ZEXT1632(auVar36));
  auVar40 = vpermps_avx512vl(auVar48,ZEXT1632(auVar15));
  auVar39 = vmulps_avx512vl(auVar40,bezier_basis0._3944_32_);
  auVar41 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._2788_32_,auVar38);
  auVar39._4_4_ = auVar40._4_4_ * fVar79;
  auVar39._0_4_ = auVar40._0_4_ * fVar77;
  auVar39._8_4_ = auVar40._8_4_ * fVar80;
  auVar39._12_4_ = auVar40._12_4_ * fVar81;
  auVar39._16_4_ = auVar40._16_4_ * fVar82;
  auVar39._20_4_ = auVar40._20_4_ * fVar83;
  auVar39._24_4_ = auVar40._24_4_ * fVar84;
  auVar39._28_4_ = auVar40._28_4_;
  auVar35 = vfmadd231ps_fma(auVar39,bezier_basis0._7412_32_,auVar38);
  auVar38 = vpermps_avx512vl(auVar48,ZEXT1632(auVar29));
  auVar39 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._1632_32_,auVar38);
  auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),bezier_basis0._6256_32_,auVar38);
  auVar38 = vpermps_avx512vl(auVar48,ZEXT1632(auVar23));
  auVar49 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._476_32_,auVar38);
  auVar38 = vfmadd231ps_avx512vl(ZEXT1632(auVar35),bezier_basis0._5100_32_,auVar38);
  auVar39 = vmulps_avx512vl(auVar38,auVar50);
  auVar56 = ZEXT832(0) << 0x20;
  auVar38 = vblendps_avx(auVar39,auVar56,1);
  auVar50 = vsubps_avx512vl(auVar49,auVar38);
  auVar38 = vblendps_avx(auVar39,auVar56,0x80);
  auVar51 = vaddps_avx512vl(auVar49,auVar38);
  auVar38 = vmaxps_avx512vl(auVar65,auVar49);
  auVar39 = vmaxps_avx512vl(auVar50,auVar51);
  auVar39 = vmaxps_avx(auVar38,auVar39);
  auVar52._0_4_ = auVar36._0_4_;
  auVar52._4_4_ = auVar52._0_4_;
  auVar52._8_4_ = auVar52._0_4_;
  auVar52._12_4_ = auVar52._0_4_;
  auVar52._16_4_ = auVar52._0_4_;
  auVar52._20_4_ = auVar52._0_4_;
  auVar52._24_4_ = auVar52._0_4_;
  auVar52._28_4_ = auVar52._0_4_;
  fVar59 = auVar15._0_4_;
  fVar67 = bezier_basis0._3944_4_;
  fVar68 = bezier_basis0._3948_4_;
  auVar40._4_4_ = fVar68 * fVar59;
  auVar40._0_4_ = fVar67 * fVar59;
  fVar69 = bezier_basis0._3952_4_;
  auVar40._8_4_ = fVar69 * fVar59;
  fVar70 = bezier_basis0._3956_4_;
  auVar40._12_4_ = fVar70 * fVar59;
  fVar71 = bezier_basis0._3960_4_;
  auVar40._16_4_ = fVar71 * fVar59;
  fVar72 = bezier_basis0._3964_4_;
  auVar40._20_4_ = fVar72 * fVar59;
  fVar73 = bezier_basis0._3968_4_;
  auVar40._24_4_ = fVar73 * fVar59;
  auVar40._28_4_ = auVar39._28_4_;
  auVar35 = vfmadd231ps_fma(auVar40,bezier_basis0._2788_32_,auVar52);
  auVar41._4_4_ = fVar79 * fVar59;
  auVar41._0_4_ = fVar77 * fVar59;
  auVar41._8_4_ = fVar80 * fVar59;
  auVar41._12_4_ = fVar81 * fVar59;
  auVar41._16_4_ = fVar82 * fVar59;
  auVar41._20_4_ = fVar83 * fVar59;
  auVar41._24_4_ = fVar84 * fVar59;
  auVar41._28_4_ = fVar59;
  auVar36 = vfmadd231ps_fma(auVar41,bezier_basis0._7412_32_,auVar52);
  auVar38 = vbroadcastss_avx512vl(auVar29);
  auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),bezier_basis0._1632_32_,auVar38);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),bezier_basis0._6256_32_,auVar38);
  auVar38 = vbroadcastss_avx512vl(auVar23);
  auVar52 = vfmadd231ps_avx512vl(ZEXT1632(auVar35),bezier_basis0._476_32_,auVar38);
  auVar38 = vfmadd231ps_avx512vl(ZEXT1632(auVar36),bezier_basis0._5100_32_,auVar38);
  auVar36 = vsubps_avx(auVar16,auVar21);
  auVar35 = vshufps_avx(auVar36,auVar36,0xaa);
  auVar26._0_4_ = auVar35._0_4_ * fVar61;
  auVar26._4_4_ = auVar35._4_4_ * fVar62;
  auVar26._8_4_ = auVar35._8_4_ * fVar63;
  auVar26._12_4_ = auVar35._12_4_ * fVar64;
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar35 = vfmadd231ps_fma(auVar26,(undefined1  [16])aVar2,auVar35);
  fVar59 = auVar36._0_4_;
  auVar85._4_4_ = fVar59;
  auVar85._0_4_ = fVar59;
  auVar85._8_4_ = fVar59;
  auVar85._12_4_ = fVar59;
  auVar15 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar1,auVar85);
  auVar35 = vsubps_avx(auVar18,auVar27);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar35 = vmulps_avx512vl(auVar35,auVar29);
  auVar16._0_4_ = auVar35._0_4_ + fVar59;
  auVar16._4_4_ = auVar35._4_4_ + auVar36._4_4_;
  auVar16._8_4_ = auVar35._8_4_ + auVar36._8_4_;
  auVar16._12_4_ = auVar35._12_4_ + auVar36._12_4_;
  auVar35 = vshufps_avx(auVar16,auVar16,0xaa);
  auVar23._0_4_ = auVar35._0_4_ * fVar61;
  auVar23._4_4_ = auVar35._4_4_ * fVar62;
  auVar23._8_4_ = auVar35._8_4_ * fVar63;
  auVar23._12_4_ = auVar35._12_4_ * fVar64;
  auVar35 = vshufps_avx(auVar16,auVar16,0x55);
  auVar35 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar2,auVar35);
  auVar21._4_4_ = auVar16._0_4_;
  auVar21._0_4_ = auVar16._0_4_;
  auVar21._8_4_ = auVar16._0_4_;
  auVar21._12_4_ = auVar16._0_4_;
  auVar27 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar1,auVar21);
  auVar36 = vsubps_avx512vl(auVar28,auVar33);
  auVar35 = vsubps_avx512vl(auVar30,auVar34);
  auVar35 = vmulps_avx512vl(auVar35,auVar29);
  auVar35 = vsubps_avx(auVar36,auVar35);
  auVar34 = vbroadcastss_avx512vl(auVar35);
  auVar33 = vshufps_avx512vl(auVar35,auVar35,0x55);
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  auVar35 = vmulps_avx512vl(auVar37,auVar35);
  auVar35 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar2,auVar33);
  auVar34 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar1,auVar34);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar40 = vpermps_avx512vl(auVar53,ZEXT1632(auVar34));
  auVar35 = vshufps_avx512vl(auVar36,auVar36,0xaa);
  auVar33 = vmulps_avx512vl(auVar37,auVar35);
  auVar37 = vbroadcastss_avx512vl(auVar36);
  auVar35 = vshufps_avx(auVar36,auVar36,0x55);
  auVar35 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar35);
  auVar33 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar1,auVar37);
  auVar41 = vpermps_avx512vl(auVar53,ZEXT1632(auVar33));
  auVar54._0_4_ = fVar67 * auVar41._0_4_;
  auVar54._4_4_ = fVar68 * auVar41._4_4_;
  auVar54._8_4_ = fVar69 * auVar41._8_4_;
  auVar54._12_4_ = fVar70 * auVar41._12_4_;
  auVar54._16_4_ = fVar71 * auVar41._16_4_;
  auVar54._20_4_ = fVar72 * auVar41._20_4_;
  auVar54._24_4_ = fVar73 * auVar41._24_4_;
  auVar54._28_4_ = 0;
  auVar35 = vfmadd231ps_fma(auVar54,bezier_basis0._2788_32_,auVar40);
  auVar41 = vmulps_avx512vl(auVar41,bezier_basis0._8568_32_);
  auVar54 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._7412_32_,auVar40);
  auVar40 = vpermps_avx512vl(auVar48,ZEXT1632(auVar34));
  auVar41 = vpermps_avx512vl(auVar48,ZEXT1632(auVar33));
  auVar42 = vmulps_avx512vl(auVar41,bezier_basis0._3944_32_);
  auVar36 = vfmadd231ps_fma(auVar42,bezier_basis0._2788_32_,auVar40);
  auVar41 = vmulps_avx512vl(auVar41,bezier_basis0._8568_32_);
  auVar55 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._7412_32_,auVar40);
  auVar41 = vbroadcastss_avx512vl(auVar34);
  fVar59 = auVar33._0_4_;
  auVar42._4_4_ = fVar68 * fVar59;
  auVar42._0_4_ = fVar67 * fVar59;
  auVar42._8_4_ = fVar69 * fVar59;
  auVar42._12_4_ = fVar70 * fVar59;
  auVar42._16_4_ = fVar71 * fVar59;
  auVar42._20_4_ = fVar72 * fVar59;
  auVar42._24_4_ = fVar73 * fVar59;
  auVar42._28_4_ = bezier_basis0._3972_4_;
  auVar34 = vfmadd231ps_fma(auVar42,auVar41,bezier_basis0._2788_32_);
  auVar44._4_4_ = fVar79 * fVar59;
  auVar44._0_4_ = fVar77 * fVar59;
  auVar44._8_4_ = fVar80 * fVar59;
  auVar44._12_4_ = fVar81 * fVar59;
  auVar44._16_4_ = fVar82 * fVar59;
  auVar44._20_4_ = fVar83 * fVar59;
  auVar44._24_4_ = fVar84 * fVar59;
  auVar44._28_4_ = bezier_basis0._2816_4_;
  auVar40 = vmaxps_avx(auVar65,auVar52);
  auVar66._8_4_ = 0x3d638e39;
  auVar66._0_8_ = 0x3d638e393d638e39;
  auVar66._12_4_ = 0x3d638e39;
  auVar66._16_4_ = 0x3d638e39;
  auVar66._20_4_ = 0x3d638e39;
  auVar66._24_4_ = 0x3d638e39;
  auVar66._28_4_ = 0x3d638e39;
  auVar9._4_4_ = auVar38._4_4_ * 0.055555556;
  auVar9._0_4_ = auVar38._0_4_ * 0.055555556;
  auVar9._8_4_ = auVar38._8_4_ * 0.055555556;
  auVar9._12_4_ = auVar38._12_4_ * 0.055555556;
  auVar9._16_4_ = auVar38._16_4_ * 0.055555556;
  auVar9._20_4_ = auVar38._20_4_ * 0.055555556;
  auVar9._24_4_ = auVar38._24_4_ * 0.055555556;
  auVar9._28_4_ = auVar38._28_4_;
  auVar33 = vfmadd231ps_fma(auVar44,bezier_basis0._7412_32_,auVar41);
  auVar38 = vblendps_avx(auVar9,auVar56,1);
  auVar41 = vsubps_avx(auVar52,auVar38);
  auVar38 = vblendps_avx(auVar9,auVar56,0x80);
  auVar78._0_4_ = auVar52._0_4_ + auVar38._0_4_;
  auVar78._4_4_ = auVar52._4_4_ + auVar38._4_4_;
  auVar78._8_4_ = auVar52._8_4_ + auVar38._8_4_;
  auVar78._12_4_ = auVar52._12_4_ + auVar38._12_4_;
  auVar78._16_4_ = auVar52._16_4_ + auVar38._16_4_;
  auVar78._20_4_ = auVar52._20_4_ + auVar38._20_4_;
  auVar78._24_4_ = auVar52._24_4_ + auVar38._24_4_;
  auVar78._28_4_ = auVar52._28_4_ + auVar38._28_4_;
  auVar38 = vmaxps_avx(auVar41,auVar78);
  auVar56 = vmaxps_avx512vl(auVar40,auVar38);
  auVar38 = vminps_avx512vl(auVar45,auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar40 = vminps_avx512vl(auVar46,auVar43);
  auVar42 = vminps_avx(auVar40,auVar38);
  auVar38 = vminps_avx512vl(auVar50,auVar51);
  auVar40 = vminps_avx512vl(auVar46,auVar49);
  auVar49 = vminps_avx512vl(auVar40,auVar38);
  auVar38 = vminps_avx(auVar41,auVar78);
  auVar40 = vminps_avx512vl(auVar46,auVar52);
  auVar44 = vminps_avx(auVar40,auVar38);
  auVar38 = vpermps_avx512vl(auVar53,ZEXT1632(auVar27));
  auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),bezier_basis0._1632_32_,auVar38);
  auVar38 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._6256_32_,auVar38);
  auVar40 = vpermps_avx512vl(auVar53,ZEXT1632(auVar15));
  auVar50 = vfmadd231ps_avx512vl(ZEXT1632(auVar35),bezier_basis0._476_32_,auVar40);
  auVar38 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._5100_32_,auVar40);
  auVar40 = vpermps_avx512vl(auVar48,ZEXT1632(auVar27));
  auVar35 = vfmadd231ps_fma(ZEXT1632(auVar36),bezier_basis0._1632_32_,auVar40);
  auVar41 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._6256_32_,auVar40);
  auVar51._0_4_ = auVar27._0_4_;
  auVar51._4_4_ = auVar51._0_4_;
  auVar51._8_4_ = auVar51._0_4_;
  auVar51._12_4_ = auVar51._0_4_;
  auVar51._16_4_ = auVar51._0_4_;
  auVar51._20_4_ = auVar51._0_4_;
  auVar51._24_4_ = auVar51._0_4_;
  auVar51._28_4_ = auVar51._0_4_;
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar51,bezier_basis0._1632_32_);
  auVar40 = vmaxps_avx512vl(auVar65,auVar50);
  auVar43 = vmulps_avx512vl(auVar38,auVar66);
  auVar34 = vfmadd231ps_fma(ZEXT1632(auVar33),bezier_basis0._6256_32_,auVar51);
  auVar54 = ZEXT832(0) << 0x20;
  auVar38 = vblendps_avx(auVar43,auVar54,1);
  auVar9 = vsubps_avx(auVar50,auVar38);
  auVar38 = vblendps_avx(auVar43,auVar54,0x80);
  auVar74._0_4_ = auVar38._0_4_ + auVar50._0_4_;
  auVar74._4_4_ = auVar38._4_4_ + auVar50._4_4_;
  auVar74._8_4_ = auVar38._8_4_ + auVar50._8_4_;
  auVar74._12_4_ = auVar38._12_4_ + auVar50._12_4_;
  auVar74._16_4_ = auVar38._16_4_ + auVar50._16_4_;
  auVar74._20_4_ = auVar38._20_4_ + auVar50._20_4_;
  auVar74._24_4_ = auVar38._24_4_ + auVar50._24_4_;
  auVar74._28_4_ = auVar38._28_4_ + auVar50._28_4_;
  auVar38 = vmaxps_avx(auVar9,auVar74);
  auVar40 = vmaxps_avx(auVar40,auVar38);
  auVar38 = vpermps_avx512vl(auVar48,ZEXT1632(auVar15));
  auVar48 = vfmadd231ps_avx512vl(ZEXT1632(auVar35),bezier_basis0._476_32_,auVar38);
  auVar38 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._5100_32_,auVar38);
  uVar57 = auVar15._0_4_;
  auVar53._4_4_ = uVar57;
  auVar53._0_4_ = uVar57;
  auVar53._8_4_ = uVar57;
  auVar53._12_4_ = uVar57;
  auVar53._16_4_ = uVar57;
  auVar53._20_4_ = uVar57;
  auVar53._24_4_ = uVar57;
  auVar53._28_4_ = uVar57;
  auVar51 = vfmadd231ps_avx512vl(ZEXT1632(auVar36),auVar53,bezier_basis0._476_32_);
  auVar41 = vmaxps_avx512vl(auVar65,auVar48);
  auVar45 = vmulps_avx512vl(auVar38,auVar66);
  auVar52 = vfmadd231ps_avx512vl(ZEXT1632(auVar34),bezier_basis0._5100_32_,auVar53);
  auVar38 = vblendps_avx(auVar45,auVar54,1);
  auVar43 = vsubps_avx(auVar48,auVar38);
  auVar38 = vblendps_avx(auVar45,auVar54,0x80);
  auVar76._0_4_ = auVar48._0_4_ + auVar38._0_4_;
  auVar76._4_4_ = auVar48._4_4_ + auVar38._4_4_;
  auVar76._8_4_ = auVar48._8_4_ + auVar38._8_4_;
  auVar76._12_4_ = auVar48._12_4_ + auVar38._12_4_;
  auVar76._16_4_ = auVar48._16_4_ + auVar38._16_4_;
  auVar76._20_4_ = auVar48._20_4_ + auVar38._20_4_;
  auVar76._24_4_ = auVar48._24_4_ + auVar38._24_4_;
  auVar76._28_4_ = auVar48._28_4_ + auVar38._28_4_;
  auVar38 = vmaxps_avx(auVar43,auVar76);
  auVar41 = vmaxps_avx(auVar41,auVar38);
  auVar53 = vmaxps_avx512vl(auVar65,auVar51);
  auVar52 = vmulps_avx512vl(auVar52,auVar66);
  auVar38 = vblendps_avx(auVar52,auVar54,1);
  auVar45 = vsubps_avx(auVar51,auVar38);
  auVar38 = vblendps_avx(auVar52,auVar54,0x80);
  auVar55._0_4_ = auVar51._0_4_ + auVar38._0_4_;
  auVar55._4_4_ = auVar51._4_4_ + auVar38._4_4_;
  auVar55._8_4_ = auVar51._8_4_ + auVar38._8_4_;
  auVar55._12_4_ = auVar51._12_4_ + auVar38._12_4_;
  auVar55._16_4_ = auVar51._16_4_ + auVar38._16_4_;
  auVar55._20_4_ = auVar51._20_4_ + auVar38._20_4_;
  auVar55._24_4_ = auVar51._24_4_ + auVar38._24_4_;
  auVar55._28_4_ = auVar51._28_4_ + auVar38._28_4_;
  auVar38 = vmaxps_avx(auVar45,auVar55);
  auVar38 = vmaxps_avx(auVar53,auVar38);
  auVar9 = vminps_avx(auVar9,auVar74);
  auVar50 = vminps_avx512vl(auVar46,auVar50);
  auVar9 = vminps_avx(auVar50,auVar9);
  auVar43 = vminps_avx(auVar43,auVar76);
  auVar48 = vminps_avx512vl(auVar46,auVar48);
  auVar43 = vminps_avx(auVar48,auVar43);
  auVar46 = vminps_avx512vl(auVar46,auVar51);
  auVar45 = vminps_avx(auVar45,auVar55);
  auVar45 = vminps_avx(auVar46,auVar45);
  auVar46 = vshufps_avx(auVar38,auVar38,0xb1);
  auVar38 = vmaxps_avx(auVar38,auVar46);
  auVar46 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vmaxps_avx(auVar38,auVar46);
  auVar35 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar38 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar38 = vmaxps_avx(auVar41,auVar38);
  auVar41 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vmaxps_avx(auVar38,auVar41);
  auVar36 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar36 = vunpcklps_avx(auVar35,auVar36);
  auVar38 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar38 = vmaxps_avx(auVar40,auVar38);
  auVar40 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vmaxps_avx(auVar38,auVar40);
  auVar35 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar35 = vinsertps_avx(auVar36,auVar35,0x28);
  auVar38 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar38 = vminps_avx(auVar45,auVar38);
  auVar40 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vminps_avx(auVar38,auVar40);
  auVar36 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar38 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar38 = vminps_avx(auVar43,auVar38);
  auVar40 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vminps_avx(auVar38,auVar40);
  auVar34 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar34 = vunpcklps_avx(auVar36,auVar34);
  auVar38 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar38 = vminps_avx(auVar9,auVar38);
  auVar40 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vminps_avx(auVar38,auVar40);
  auVar36 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar36 = vinsertps_avx(auVar34,auVar36,0x28);
  auVar38 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar38 = vminps_avx(auVar44,auVar38);
  auVar40 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vminps_avx(auVar38,auVar40);
  auVar34 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar38 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar38 = vminps_avx(auVar49,auVar38);
  auVar40 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vminps_avx(auVar38,auVar40);
  auVar33 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar33 = vunpcklps_avx(auVar34,auVar33);
  auVar38 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar38 = vminps_avx(auVar42,auVar38);
  auVar40 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vminps_avx(auVar38,auVar40);
  auVar34 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar34 = vinsertps_avx(auVar33,auVar34,0x28);
  auVar33 = vminps_avx(auVar36,auVar34);
  auVar38 = vshufps_avx512vl(auVar56,auVar56,0xb1);
  auVar40 = vmaxps_avx512vl(auVar56,auVar38);
  auVar38 = vshufpd_avx(auVar40,auVar40,5);
  auVar38 = vmaxps_avx(auVar40,auVar38);
  auVar36 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar38 = vshufps_avx(auVar39,auVar39,0xb1);
  auVar38 = vmaxps_avx(auVar39,auVar38);
  auVar39 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vmaxps_avx(auVar38,auVar39);
  auVar34 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar34 = vunpcklps_avx(auVar36,auVar34);
  auVar38 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar38 = vmaxps_avx(auVar47,auVar38);
  auVar39 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vmaxps_avx(auVar38,auVar39);
  auVar36 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar36 = vinsertps_avx(auVar34,auVar36,0x28);
  auVar34 = vmaxps_avx(auVar35,auVar36);
  auVar37._8_4_ = 0x7fffffff;
  auVar37._0_8_ = 0x7fffffff7fffffff;
  auVar37._12_4_ = 0x7fffffff;
  auVar35 = vandps_avx(auVar33,auVar37);
  auVar36 = vandps_avx(auVar34,auVar37);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar36 = vmovshdup_avx(auVar35);
  auVar36 = vmaxss_avx(auVar36,auVar35);
  auVar35 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vmaxss_avx(auVar35,auVar36);
  fVar59 = auVar35._0_4_ * 4.7683716e-07;
  auVar30._4_4_ = fVar59;
  auVar30._0_4_ = fVar59;
  auVar30._8_4_ = fVar59;
  auVar30._12_4_ = fVar59;
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar33,auVar30);
  (__return_storage_ptr__->lower).field_0 = aVar1;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar34._0_4_ + fVar59;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar34._4_4_ + fVar59;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar34._8_4_ + fVar59;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar34._12_4_ + fVar59;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }